

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType __thiscall ValueType::SetArrayTypeId(ValueType *this,TypeId typeId)

{
  Bits e0;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  Bits BVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar5;
  undefined4 *puVar6;
  Bits local_1e;
  TypeId local_1c;
  Bits newBits;
  ValueType *pVStack_18;
  TypeId typeId_local;
  ValueType *this_local;
  
  local_1c = typeId;
  pVStack_18 = this;
  bVar2 = IsLikelyArrayOrObjectWithArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x330,"(IsLikelyArrayOrObjectWithArray())",
                       "IsLikelyArrayOrObjectWithArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array(local_1c);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x331,"(JavascriptArray::IsNonES5Array(typeId))",
                       "JavascriptArray::IsNonES5Array(typeId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((local_1c != TypeIds_Array) &&
     ((bVar2 = IsLikelyObject(this), !bVar2 || (OVar3 = GetObjectType(this), OVar3 != Array)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x332,
                       "(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array)"
                       ,
                       "typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  e0 = (this->field_0).bits;
  BVar4 = operator|(IntCanBeUntagged,IntIsLikelyUntagged);
  BVar4 = operator~(BVar4);
  local_1e = ::operator&(e0,BVar4);
  if (local_1c == TypeIds_Array) {
    operator|=(&local_1e,IntIsLikelyUntagged);
  }
  else if (local_1c != TypeIds_ArrayLast) goto LAB_0102c6f6;
  operator|=(&local_1e,IntCanBeUntagged);
LAB_0102c6f6:
  aVar5.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(local_1e);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar5.field_0;
}

Assistant:

ValueType ValueType::SetArrayTypeId(const Js::TypeId typeId) const
{
    using namespace Js;
    Assert(IsLikelyArrayOrObjectWithArray());
    Assert(JavascriptArray::IsNonES5Array(typeId));
    Assert(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array); // objects with native arrays are currently not supported

    Bits newBits = bits & ~(Bits::NonInts | Bits::NonFloats);
    switch(typeId)
    {
        case TypeIds_Array:
            newBits |= Bits::NonFloats;
            // fall through

        case TypeIds_NativeFloatArray:
            newBits |= Bits::NonInts;
            break;
    }
    return Verify(newBits);
}